

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::anon_unknown_54::protobuf_RegisterTypes(string *param_1)

{
  Descriptor *pDVar1;
  FileDescriptorSet *prototype;
  FileDescriptorProto *prototype_00;
  DescriptorProto *prototype_01;
  DescriptorProto_ExtensionRange *prototype_02;
  FieldDescriptorProto *prototype_03;
  EnumDescriptorProto *prototype_04;
  EnumValueDescriptorProto *prototype_05;
  ServiceDescriptorProto *prototype_06;
  MethodDescriptorProto *prototype_07;
  FileOptions *prototype_08;
  MessageOptions *prototype_09;
  FieldOptions *prototype_10;
  EnumOptions *prototype_11;
  EnumValueOptions *prototype_12;
  ServiceOptions *prototype_13;
  MethodOptions *prototype_14;
  UninterpretedOption *prototype_15;
  UninterpretedOption_NamePart *prototype_16;
  SourceCodeInfo *prototype_17;
  SourceCodeInfo_Location *prototype_18;
  
  protobuf_AssignDescriptorsOnce();
  pDVar1 = (anonymous_namespace)::FileDescriptorSet_descriptor_;
  prototype = FileDescriptorSet::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype->super_Message);
  pDVar1 = (anonymous_namespace)::FileDescriptorProto_descriptor_;
  prototype_00 = FileDescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_00->super_Message);
  pDVar1 = (anonymous_namespace)::DescriptorProto_descriptor_;
  prototype_01 = DescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_01->super_Message);
  pDVar1 = (anonymous_namespace)::DescriptorProto_ExtensionRange_descriptor_;
  prototype_02 = DescriptorProto_ExtensionRange::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_02->super_Message);
  pDVar1 = (anonymous_namespace)::FieldDescriptorProto_descriptor_;
  prototype_03 = FieldDescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_03->super_Message);
  pDVar1 = (anonymous_namespace)::EnumDescriptorProto_descriptor_;
  prototype_04 = EnumDescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_04->super_Message);
  pDVar1 = (anonymous_namespace)::EnumValueDescriptorProto_descriptor_;
  prototype_05 = EnumValueDescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_05->super_Message);
  pDVar1 = (anonymous_namespace)::ServiceDescriptorProto_descriptor_;
  prototype_06 = ServiceDescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_06->super_Message);
  pDVar1 = (anonymous_namespace)::MethodDescriptorProto_descriptor_;
  prototype_07 = MethodDescriptorProto::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_07->super_Message);
  pDVar1 = (anonymous_namespace)::FileOptions_descriptor_;
  prototype_08 = FileOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_08->super_Message);
  pDVar1 = (anonymous_namespace)::MessageOptions_descriptor_;
  prototype_09 = MessageOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_09->super_Message);
  pDVar1 = (anonymous_namespace)::FieldOptions_descriptor_;
  prototype_10 = FieldOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_10->super_Message);
  pDVar1 = (anonymous_namespace)::EnumOptions_descriptor_;
  prototype_11 = EnumOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_11->super_Message);
  pDVar1 = (anonymous_namespace)::EnumValueOptions_descriptor_;
  prototype_12 = EnumValueOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_12->super_Message);
  pDVar1 = (anonymous_namespace)::ServiceOptions_descriptor_;
  prototype_13 = ServiceOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_13->super_Message);
  pDVar1 = (anonymous_namespace)::MethodOptions_descriptor_;
  prototype_14 = MethodOptions::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_14->super_Message);
  pDVar1 = (anonymous_namespace)::UninterpretedOption_descriptor_;
  prototype_15 = UninterpretedOption::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_15->super_Message);
  pDVar1 = (anonymous_namespace)::UninterpretedOption_NamePart_descriptor_;
  prototype_16 = UninterpretedOption_NamePart::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_16->super_Message);
  pDVar1 = (anonymous_namespace)::SourceCodeInfo_descriptor_;
  prototype_17 = SourceCodeInfo::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_17->super_Message);
  pDVar1 = (anonymous_namespace)::SourceCodeInfo_Location_descriptor_;
  prototype_18 = SourceCodeInfo_Location::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_18->super_Message);
  return;
}

Assistant:

void protobuf_RegisterTypes(const ::std::string&) {
  protobuf_AssignDescriptorsOnce();
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    FileDescriptorSet_descriptor_, &FileDescriptorSet::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    FileDescriptorProto_descriptor_, &FileDescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    DescriptorProto_descriptor_, &DescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    DescriptorProto_ExtensionRange_descriptor_, &DescriptorProto_ExtensionRange::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    FieldDescriptorProto_descriptor_, &FieldDescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    EnumDescriptorProto_descriptor_, &EnumDescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    EnumValueDescriptorProto_descriptor_, &EnumValueDescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    ServiceDescriptorProto_descriptor_, &ServiceDescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    MethodDescriptorProto_descriptor_, &MethodDescriptorProto::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    FileOptions_descriptor_, &FileOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    MessageOptions_descriptor_, &MessageOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    FieldOptions_descriptor_, &FieldOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    EnumOptions_descriptor_, &EnumOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    EnumValueOptions_descriptor_, &EnumValueOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    ServiceOptions_descriptor_, &ServiceOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    MethodOptions_descriptor_, &MethodOptions::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    UninterpretedOption_descriptor_, &UninterpretedOption::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    UninterpretedOption_NamePart_descriptor_, &UninterpretedOption_NamePart::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    SourceCodeInfo_descriptor_, &SourceCodeInfo::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    SourceCodeInfo_Location_descriptor_, &SourceCodeInfo_Location::default_instance());
}